

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Fire_PDU::Encode(Fire_PDU *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  Descriptor *pDVar2;
  undefined1 local_38 [8];
  MunitionDescriptor md;
  KDataStream *stream_local;
  Fire_PDU *this_local;
  
  md._24_8_ = stream;
  Warfare_Header::Encode(&this->super_Warfare_Header,stream);
  pKVar1 = KDataStream::operator<<((KDataStream *)md._24_8_,this->m_ui32FireMissionIndex);
  DATA_TYPE::operator<<(pKVar1,&(this->m_Location).super_DataTypeBase);
  pDVar2 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::GetPtr(&this->m_pDescriptor);
  if (pDVar2 == (Descriptor *)0x0) {
    DATA_TYPE::MunitionDescriptor::MunitionDescriptor((MunitionDescriptor *)local_38);
    DATA_TYPE::operator<<((KDataStream *)md._24_8_,(DataTypeBase *)local_38);
    DATA_TYPE::MunitionDescriptor::~MunitionDescriptor((MunitionDescriptor *)local_38);
  }
  else {
    pDVar2 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator->(&this->m_pDescriptor);
    (*(pDVar2->super_DataTypeBase)._vptr_DataTypeBase[5])(pDVar2,md._24_8_);
  }
  pKVar1 = DATA_TYPE::operator<<((KDataStream *)md._24_8_,&(this->m_Velocity).super_DataTypeBase);
  KDataStream::operator<<(pKVar1,(float)this->m_f32Range);
  return;
}

Assistant:

void Fire_PDU::Encode( KDataStream & stream ) const
{
    Warfare_Header::Encode( stream );
    stream << m_ui32FireMissionIndex
           << KDIS_STREAM m_Location;

    if( !m_pDescriptor.GetPtr() )
    {
        // Create a temp to fill the buffer.
        MunitionDescriptor md;
        stream << KDIS_STREAM md;
    }
    else
    {
        m_pDescriptor->Encode( stream );
    }

    stream << KDIS_STREAM m_Velocity
           << m_f32Range;
}